

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::anon_unknown_61::ValidateRasterizerStateDesc
               (PipelineStateDesc *PSODesc,GraphicsPipelineDesc *GraphicsPipeline,
               DeviceFeatures *Features)

{
  long lVar1;
  long lVar2;
  undefined *puVar3;
  undefined8 uVar4;
  char *local_90;
  char *local_88;
  undefined1 local_70 [8];
  string _msg;
  char *local_48;
  char *local_40;
  char *local_38;
  RasterizerStateDesc *local_30;
  RasterizerStateDesc *RSDesc;
  DeviceFeatures *Features_local;
  GraphicsPipelineDesc *GraphicsPipeline_local;
  PipelineStateDesc *PSODesc_local;
  
  local_30 = &GraphicsPipeline->RasterizerDesc;
  RSDesc = (RasterizerStateDesc *)Features;
  Features_local = (DeviceFeatures *)GraphicsPipeline;
  GraphicsPipeline_local = (GraphicsPipelineDesc *)PSODesc;
  if (local_30->FillMode == FILL_MODE_UNDEFINED) {
    local_38 = GetPipelineTypeString(PSODesc->PipelineType);
    lVar1._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
    lVar1._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
    lVar1._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
    lVar1._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
    lVar1._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
    lVar1._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
    lVar1._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
    lVar1._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
    if (lVar1 == 0) {
      local_88 = "";
    }
    else {
      local_88 = *(char **)&GraphicsPipeline_local->BlendDesc;
    }
    local_40 = local_88;
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[57]>
              (false,"ValidateRasterizerStateDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x31,(char (*) [16])"Description of ",&local_38,(char (*) [7])0x45b448,&local_40,
               (char (*) [15])"\' is invalid: ",
               (char (*) [57])"RasterizerDesc.FillMode must not be FILL_MODE_UNDEFINED.");
  }
  if (local_30->CullMode == CULL_MODE_UNDEFINED) {
    local_48 = GetPipelineTypeString
                         ((GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlendAlpha);
    lVar2._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
    lVar2._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
    lVar2._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
    lVar2._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
    lVar2._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
    lVar2._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
    lVar2._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
    lVar2._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
    if (lVar2 == 0) {
      local_90 = "";
    }
    else {
      local_90 = *(char **)&GraphicsPipeline_local->BlendDesc;
    }
    _msg.field_2._8_8_ = local_90;
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[57]>
              (false,"ValidateRasterizerStateDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x33,(char (*) [16])"Description of ",&local_48,(char (*) [7])0x45b448,
               (char **)((long)&_msg.field_2 + 8),(char (*) [15])"\' is invalid: ",
               (char (*) [57])"RasterizerDesc.CullMode must not be CULL_MODE_UNDEFINED.");
  }
  if (((local_30->DepthClipEnable & 1U) == 0) && (*(char *)&RSDesc->SlopeScaledDepthBias == '\0')) {
    FormatString<char[104]>
              ((string *)local_70,
               (char (*) [104])
               "Disabling depth clip is not supported by this device. Check the value of the DepthClamp device feature."
              );
    puVar3 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar4 = std::__cxx11::string::c_str();
      (*(code *)puVar3)(2,uVar4,0);
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  return;
}

Assistant:

void ValidateRasterizerStateDesc(const PipelineStateDesc& PSODesc, const GraphicsPipelineDesc& GraphicsPipeline, const DeviceFeatures& Features) noexcept(false)
{
    const RasterizerStateDesc& RSDesc = GraphicsPipeline.RasterizerDesc;
    if (RSDesc.FillMode == FILL_MODE_UNDEFINED)
        LOG_PSO_ERROR_AND_THROW("RasterizerDesc.FillMode must not be FILL_MODE_UNDEFINED.");
    if (RSDesc.CullMode == CULL_MODE_UNDEFINED)
        LOG_PSO_ERROR_AND_THROW("RasterizerDesc.CullMode must not be CULL_MODE_UNDEFINED.");
    if (!RSDesc.DepthClipEnable && Features.DepthClamp == DEVICE_FEATURE_STATE_DISABLED)
        LOG_ERROR_MESSAGE("Disabling depth clip is not supported by this device. Check the value of the DepthClamp device feature.");
}